

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat4 * dja::mat4::homogeneous::scale(mat4 *__return_storage_ptr__,vec3 *values)

{
  mat3 local_34;
  vec3 *local_10;
  vec3 *values_local;
  
  local_10 = values;
  mat3::scale(&local_34,values);
  from_mat3(__return_storage_ptr__,&local_34);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4::homogeneous::scale(const vec3& values)
{
    return mat4::homogeneous::from_mat3(mat3::scale(values));
}